

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O2

int dlep_session_add(dlep_session *session,char *l2_ifname,oonf_layer2_origin *l2_origin,
                    oonf_layer2_origin *l2_default_origin,autobuf *out,_Bool radio,
                    _func_int_os_interface_listener_ptr *if_changed,oonf_log_source log_source)

{
  size_t *psVar1;
  list_entity *plVar2;
  int iVar3;
  os_interface *poVar4;
  dlep_parser_value *pdVar5;
  avl_tree *paVar6;
  avl_tree *paVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  
  avl_init(&session->parser,avl_comp_uint16,0);
  avl_init(&session->local_neighbor_tree,oonf_layer2_avlcmp_neigh_key,0);
  session->log_source = log_source;
  session->l2_origin = l2_origin;
  session->l2_default_origin = l2_default_origin;
  session->radio = radio;
  (session->writer).out = out;
  session->_peer_state = DLEP_PEER_WAIT_FOR_INIT;
  (session->l2_listener).name = l2_ifname;
  (session->l2_listener).if_changed = if_changed;
  poVar4 = os_interface_linux_add(&session->l2_listener);
  if (poVar4 == (os_interface *)0x0) {
    uVar9 = (ulong)session->log_source;
    if (((&log_global_mask)[uVar9] & 4) == 0) goto LAB_0011ea49;
    pcVar10 = "Cannot activate interface listener for %s";
    uVar8 = 0x92;
  }
  else {
    pdVar5 = (dlep_parser_value *)calloc(0x80,8);
    (session->parser).values = pdVar5;
    if (pdVar5 == (dlep_parser_value *)0x0) {
      uVar9 = (ulong)session->log_source;
      if (((&log_global_mask)[uVar9] & 4) == 0) goto LAB_0011ea49;
      pcVar10 = "Cannot allocate values buffer for %s";
      uVar8 = 0x99;
    }
    else {
      paVar6 = dlep_extension_get_tree();
      while( true ) {
        paVar6 = (avl_tree *)(paVar6->list_head).next;
        plVar2 = (paVar6->list_head).prev;
        paVar7 = dlep_extension_get_tree();
        if (plVar2 == (paVar7->list_head).prev) break;
        if (((&log_global_mask)[session->log_source] & 1) != 0) {
          oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0xa0,0,0,
                   "Add extension %d to session",*(undefined4 *)&paVar6[-4].root);
        }
        (session->parser).extensions[(session->parser).extension_count] =
             (dlep_extension *)&paVar6[-4].root;
        psVar1 = &(session->parser).extension_count;
        *psVar1 = *psVar1 + 1;
      }
      iVar3 = _update_allowed_tlvs(session);
      if (iVar3 == 0) {
        avl_init(&session->_ext_ip,avl_comp_netaddr,0);
        if (((&log_global_mask)[session->log_source] & 2) == 0) {
          return 0;
        }
        oonf_log(2,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0xad,0,0,
                 "Add session on %s",(session->l2_listener).name);
        return 0;
      }
      uVar9 = (ulong)session->log_source;
      if (((&log_global_mask)[uVar9] & 4) == 0) goto LAB_0011ea49;
      pcVar10 = "Could not update allowed TLVs for %s";
      uVar8 = 0xa6;
    }
  }
  oonf_log(4,uVar9,"src/generic/dlep/dlep_session.c",uVar8,0,0,pcVar10,l2_ifname);
LAB_0011ea49:
  dlep_session_remove(session);
  return -1;
}

Assistant:

int
dlep_session_add(struct dlep_session *session, const char *l2_ifname, const struct oonf_layer2_origin *l2_origin,
  const struct oonf_layer2_origin *l2_default_origin, struct autobuf *out, bool radio,
  int (*if_changed)(struct os_interface_listener *), enum oonf_log_source log_source) {
  struct dlep_session_parser *parser;
  struct dlep_extension *ext;

  parser = &session->parser;

  avl_init(&parser->allowed_tlvs, avl_comp_uint16, false);
  avl_init(&session->local_neighbor_tree, oonf_layer2_avlcmp_neigh_key, false);

  session->log_source = log_source;
  session->l2_origin = l2_origin;
  session->l2_default_origin = l2_default_origin;
  session->radio = radio;
  session->writer.out = out;
  session->_peer_state = DLEP_PEER_WAIT_FOR_INIT;

  /* remember interface name */
  session->l2_listener.name = l2_ifname;
  session->l2_listener.if_changed = if_changed;

  /* get interface listener to lock interface */
  if (!os_interface_add(&session->l2_listener)) {
    OONF_WARN(session->log_source, "Cannot activate interface listener for %s", l2_ifname);
    dlep_session_remove(session);
    return -1;
  }

  parser->values = calloc(SESSION_VALUE_STEP, sizeof(struct dlep_parser_value));
  if (!parser->values) {
    OONF_WARN(session->log_source, "Cannot allocate values buffer for %s", l2_ifname);
    dlep_session_remove(session);
    return -1;
  }

  /* generate full list of extensions */
  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    OONF_DEBUG(session->log_source, "Add extension %d to session", ext->id);
    parser->extensions[parser->extension_count] = ext;
    parser->extension_count++;
  }

  if (_update_allowed_tlvs(session)) {
    OONF_WARN(session->log_source, "Could not update allowed TLVs for %s", l2_ifname);
    dlep_session_remove(session);
    return -1;
  }

  avl_init(&session->_ext_ip.prefix_modification, avl_comp_netaddr, false);

  OONF_INFO(session->log_source, "Add session on %s", session->l2_listener.name);
  return 0;
}